

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

int usageAndExit(char *argv0,int ec)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  poVar1 = std::operator<<(poVar1,"[--imf|--core] <file1> [<file2>...]");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return (int)poVar1;
}

Assistant:

static int
usageAndExit (const char* argv0, int ec)
{
    std::cerr << "Usage: " << argv0 << "[--imf|--core] <file1> [<file2>...]"
              << std::endl;
    return ec;
}